

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber *
partial_multiplication(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2,uint r)

{
  unsigned_long uVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  unsigned_long j;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  BigNumber tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> resultat_intermedaire;
  uint local_10c;
  BigNumber *local_108;
  BigNumber *local_100;
  uint local_f8;
  uint local_f4;
  ulong local_f0;
  BigNumber local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  BigNumber local_a8;
  BigNumber local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  BigNumber local_50;
  
  uVar1 = nb1->m_base;
  local_100 = nb1;
  Polynome::Polynome(&__return_storage_ptr__->super_Polynome);
  __return_storage_ptr__->m_base = uVar1;
  local_108 = __return_storage_ptr__;
  for (uVar17 = 0;
      puVar2 = (local_100->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar17 < ((ulong)((long)(local_100->super_Polynome).m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2 &
               0xffffffff); uVar17 = uVar17 + 1) {
    local_10c = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    local_f8 = puVar2[uVar17];
    local_f4 = local_f8 & 0xffff;
    local_f8 = local_f8 >> 0x10;
    uVar15 = 0;
    local_f0 = uVar17;
    while( true ) {
      puVar2 = (nb2->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(nb2->super_Polynome).m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar15) break;
      if (uVar15 + uVar17 < (ulong)r) {
        uVar5 = puVar2[uVar15];
        uVar4 = uVar5 >> 0x10;
        uVar5 = uVar5 & 0xffff;
        uVar7 = uVar5 * local_f4;
        uVar6 = uVar4 * local_f4;
        uVar5 = uVar5 * local_f8;
        uVar4 = uVar4 * local_f8;
        uVar8 = local_10c & 0xffff;
        uVar12 = 0x10000 - uVar8;
        uVar3 = uVar7 & 0xffff;
        iVar16 = (uint)(uVar12 <= uVar3) + (local_10c >> 0x10);
        uVar7 = uVar7 >> 0x10;
        iVar10 = iVar16 + -0x10000;
        if (uVar7 < 0x10000U - iVar16) {
          iVar10 = iVar16;
        }
        uVar11 = (uint)(0x10000U - iVar16 <= uVar7);
        iVar10 = iVar10 + uVar7;
        uVar9 = uVar6 & 0xffff;
        uVar7 = uVar11 + 1;
        if (uVar9 < 0x10000U - iVar10) {
          uVar7 = uVar11;
        }
        iVar16 = iVar10 + -0x10000;
        if (uVar9 < 0x10000U - iVar10) {
          iVar16 = iVar10;
        }
        uVar14 = (uVar7 + 1) - (uint)((uVar5 & 0xffff) < 0x10000 - (iVar16 + uVar9));
        uVar11 = uVar4 & 0xffff;
        uVar7 = uVar14 | 0xffff0000;
        if (uVar11 < 0x10000 - uVar14) {
          uVar7 = uVar14;
        }
        uVar14 = (uint)(0x10000 - uVar14 <= uVar11);
        iVar13 = uVar7 + uVar11;
        uVar6 = uVar6 >> 0x10;
        iVar10 = iVar13 + -0x10000;
        if (uVar6 < 0x10000U - iVar13) {
          iVar10 = iVar13;
        }
        uVar7 = uVar14 + 1;
        if (uVar6 < 0x10000U - iVar13) {
          uVar7 = uVar14;
        }
        iVar10 = iVar10 + uVar6;
        uVar6 = uVar5 >> 0x10;
        iVar13 = iVar10 + -0x10000;
        if (uVar6 < 0x10000U - iVar10) {
          iVar13 = iVar10;
        }
        iVar10 = (0x10000U - iVar10 <= uVar6) + uVar7;
        uVar4 = uVar4 >> 0x10;
        local_10c = ((iVar13 + uVar6 + 1) - (uint)(uVar4 < 0x10000U - iVar10)) +
                    (iVar10 + uVar4) * 0x10000;
        local_e8.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             uVar3 + uVar8 + (uint)(uVar3 < uVar12) * 0x10000 + -0x10000 +
             (iVar16 + uVar9 + uVar5) * 0x10000;
        if (local_100->m_base >> 0x20 == 0) {
          local_e8.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (uint)((ulong)(uint)local_e8.super_Polynome.m_coef.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start %
                     (local_100->m_base & 0xffffffff));
          local_10c = 0;
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,(uint *)&local_e8)
        ;
        uVar17 = local_f0;
      }
      uVar15 = uVar15 + 1;
    }
    if (local_10c != 0) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,&local_10c);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
    BigNumber::BigNumber
              (&local_e8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
               local_100->m_base);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    BigNumber::operator>>(&local_e8,(int)uVar17);
    BigNumber::BigNumber(&local_a8,local_108);
    BigNumber::BigNumber(&local_88,&local_e8);
    operator+(&local_50,&local_a8,&local_88);
    BigNumber::operator=(local_108,&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
  }
  return local_108;
}

Assistant:

BigNumber partial_multiplication(BigNumber& nb1, BigNumber& nb2, const unsigned int r){
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    const unsigned int SIZE_INT16 = 65536;
    BigNumber resultat(nb1.m_base);
    for(unsigned long i = 0; i < nb1.m_degre() ; i++) {
        unsigned int retenue = 0;
        vector<unsigned int> resultat_intermedaire;

        /*
         * On split la valeur du m_coef de 32 bits en deux valeurs de 16 bits
         * On a m_coef = [high1 low1]
         */
        const unsigned int high1 = (nb1.m_coef[i] >> 16);
        const unsigned int low1 = (nb1.m_coef[i] & 0x0000FFFF);

        for (unsigned long j = 0; j < nb2.m_coef.size(); j++) {
            /*
             * Calcul des résultats intermédiaires des sous-blocks de 16bits des opérandes
             */
            if(i + j < r) {

                const unsigned int high2 = (nb2.m_coef[j] >> 16);
                const unsigned int low2 = (nb2.m_coef[j] & 0x0000FFFF);

                /*
                 * On multiplie de nombre de 16 bits; le résultat sera inferieur a 32bits donc pas d'overflow
                 */
                const unsigned int res1 = low1 * low2;
                const unsigned int res2 = high2 * low1;
                const unsigned int res3 = low2 * high1;
                const unsigned int res4 = high1 * high2;


                /*
                 * Calcul du résultat de la multiplication sur 32 bits
                 */


                unsigned int resultat32b = 0;

                /*
                 * Le resultat de la multiplication est donné par [left1, right1]
                 * La retenue est donné par [left2, right2]
                 */
                unsigned int right2 = 0;
                unsigned int left2 = 0;
                unsigned int left1 = 0;
                /*
                 * On initialise a la valeur de la retenue précédente
                 */
                unsigned int right1 = retenue;
                retenue = 0;

                /*
                 * Valeurs sur 16bits ! Si ca dépasse on fait passer l'exédent sur les 16bits suivants
                 * right1 -> left1
                 * left1 -> right2
                 * right2 -> left2
                 * left2 -> retenue
                 */
                left1 = right1 / SIZE_INT16;
                right1 = right1 % SIZE_INT16;

                /*
                 * On additionne avec prudence en vérifiant les overflows possible
                 * pour former le résultat et la retenue sur 32 bits
                 */
                if (SIZE_INT16 - right1 > (res1 & 0x0000FFFF)) {
                    right1 += (res1 & 0x0000FFFF);
                } else {
                    right1 -= SIZE_INT16;
                    right1 += (res1 & 0x0000FFFF);
                    left1 += 1;
                }

                if (SIZE_INT16 - left1 > (res1 >> 16)) {
                    left1 += (res1 >> 16);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res1 >> 16);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res2 & 0x0000FFFF)) {
                    left1 += (res2 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res2 & 0x0000FFFF);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res3 & 0x0000FFFF)) {
                    left1 += (res3 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res3 & 0x0000FFFF);
                    right2 += 1;
                }

                /*
                 * Calcul de la retenue
                 */

                if (SIZE_INT16 - right2 > (res4 & 0x0000FFFF)) {
                    right2 += (res4 & 0x0000FFFF);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res4 & 0x0000FFFF);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res2 >> 16)) {
                    right2 += (res2 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res2 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res3 >> 16)) {
                    right2 += (res3 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res3 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - left2 > (res4 >> 16)) {
                    left2 += (res4 >> 16);
                } else {
                    left2 -= SIZE_INT16;
                    left2 += (res4 >> 16);
                    retenue += 1;
                }

                retenue += (left2 << 16) + right2;
                resultat32b += (left1 << 16) + right1;
                if (nb1.m_base < 4294967296) {
                    resultat32b = resultat32b % (unsigned int) nb1.m_base;
                    retenue = resultat32b / (unsigned int) nb1.m_base;
                }
                resultat_intermedaire.emplace_back(resultat32b);
            }
        }

        if(retenue != 0){
            resultat_intermedaire.emplace_back(retenue);
        }
        BigNumber tmp(resultat_intermedaire, nb1.m_base);
        tmp >> i;
        resultat = resultat + tmp;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << "Multiplication : " << t_tmp / (float)cmp << endl;

    return resultat;
}